

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

Maybe<kj::Array<unsigned_char>_> * __thiscall
kj::Exception::releaseDetail
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Detail *pDVar4;
  Detail *this_00;
  Array<unsigned_char> result;
  Array<unsigned_char> local_48;
  
  this_00 = (this->details).builder.ptr;
  while( true ) {
    if (this_00 == (this->details).builder.pos) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    if (this_00->id == typeId) break;
    this_00 = this_00 + 1;
  }
  local_48.ptr = (this_00->value).ptr;
  local_48.size_ = (this_00->value).size_;
  local_48.disposer = (this_00->value).disposer;
  (this_00->value).ptr = (uchar *)0x0;
  (this_00->value).size_ = 0;
  pDVar4 = (this->details).builder.pos + -1;
  if (this_00 != pDVar4) {
    Detail::operator=(this_00,pDVar4);
  }
  pAVar3 = local_48.disposer;
  sVar2 = local_48.size_;
  puVar1 = local_48.ptr;
  ArrayBuilder<kj::Exception::Detail>::removeLast(&(this->details).builder);
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = puVar1;
  (__return_storage_ptr__->ptr).field_1.value.size_ = sVar2;
  (__return_storage_ptr__->ptr).field_1.value.disposer = pAVar3;
  local_48.ptr = (uchar *)0x0;
  local_48.size_ = 0;
  Array<unsigned_char>::~Array(&local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<byte>> Exception::releaseDetail(DetailTypeId typeId) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      kj::Array<byte> result = kj::mv(detail.value);
      if (&detail != &details.back()) {
        detail = kj::mv(details.back());
      }
      details.removeLast();
      return kj::mv(result);
    }
  }
  return kj::none;
}